

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

FString __thiscall FScanner::TokenName(FScanner *this,int token,char *string)

{
  char tail;
  FString work;
  FString local_30;
  FString local_28;
  
  local_30.Chars = FString::NullString.Nothing;
  if (token - 0x21U < 0xdf) {
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    FString::FString(&local_28,'\'');
    FString::operator=(&local_30,&local_28);
    FString::~FString(&local_28);
    FString::operator+=(&local_30,(char)token);
    FString::operator+=(&local_30,'\'');
  }
  else {
    if (0x8e < token - 0x101U) {
      this->String = (char *)0x723dac;
      FString::NullString.RefCount = FString::NullString.RefCount + 2;
      FString::Format((FString *)this,"Unknown(%d)",(ulong)(uint)token);
      goto LAB_00486493;
    }
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    FString::operator=(&local_30,
                       _ZZN8FScanner9TokenNameEiPKcE5names_rel +
                       *(int *)(_ZZN8FScanner9TokenNameEiPKcE5names_rel +
                               (ulong)(token - 0x101U) * 4));
    if ((uint)token < 0x107 && string != (char *)0x0) {
      FString::operator+=(&local_30,' ');
      tail = (token != 0x102) * '\x05' + '\"';
      FString::operator+=(&local_30,tail);
      FString::operator+=(&local_30,string);
      FString::operator+=(&local_30,tail);
    }
  }
  FString::AttachToOther((FString *)this,&local_30);
LAB_00486493:
  FString::~FString(&local_30);
  return (FString)(char *)this;
}

Assistant:

FString FScanner::TokenName (int token, const char *string)
{
	static const char *const names[] =
	{
#define xx(sym,str)		str,
#include "sc_man_tokens.h"
	};

	FString work;

	if (token > ' ' && token < 256)
	{
		work = '\'';
		work += token;
		work += '\'';
	}
	else if (token >= TK_Identifier && token < TK_LastToken)
	{
		work = names[token - TK_Identifier];
		if (string != NULL && token >= TK_Identifier && token <= TK_FloatConst)
		{
			work += ' ';
			char quote = (token == TK_StringConst) ? '"' : '\'';
			work += quote;
			work += string;
			work += quote;
		}
	}
	else
	{
		FString work;
		work.Format ("Unknown(%d)", token);
		return work;
	}
	return work;
}